

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::SimpleRecurrentLayerParams::SharedDtor(SimpleRecurrentLayerParams *this)

{
  if (this != (SimpleRecurrentLayerParams *)&_SimpleRecurrentLayerParams_default_instance_) {
    if (this->activation_ != (ActivationParams *)0x0) {
      (*(this->activation_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->weightmatrix_ != (WeightParams *)0x0) {
      (*(this->weightmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->recursionmatrix_ != (WeightParams *)0x0) {
      (*(this->recursionmatrix_->super_MessageLite)._vptr_MessageLite[1])();
    }
    if (this->biasvector_ != (WeightParams *)0x0) {
      (*(this->biasvector_->super_MessageLite)._vptr_MessageLite[1])();
      return;
    }
  }
  return;
}

Assistant:

void SimpleRecurrentLayerParams::SharedDtor() {
  if (this != internal_default_instance()) {
    delete activation_;
  }
  if (this != internal_default_instance()) {
    delete weightmatrix_;
  }
  if (this != internal_default_instance()) {
    delete recursionmatrix_;
  }
  if (this != internal_default_instance()) {
    delete biasvector_;
  }
}